

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::handleProtectEncoding
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  size_type sVar1;
  bool bVar2;
  ParenPragmaExpressionSyntax *pPVar3;
  SyntaxNode *pSVar4;
  NameValuePragmaExpressionSyntax *pNVar5;
  PragmaExpressionSyntax *pPVar6;
  optional<unsigned_int> oVar7;
  Diagnostic *pDVar8;
  ProtectEncoding PVar9;
  string_view sVar10;
  string_view arg;
  SourceRange SVar11;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  allocator<char> local_99;
  Token keyword_local;
  string valueText;
  Token value;
  const_iterator __begin2;
  string_view local_40;
  
  keyword_local.info = keyword.info;
  keyword_local._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    SVar11 = Token::range(&keyword_local);
  }
  else {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                           (&args->super_SyntaxNode), (pPVar3->values).elements.size_ != 0)) {
      this->protectLineLength = 0;
      this->protectBytes = 0;
      pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                         (&args->super_SyntaxNode);
      __begin2.index = 0;
      sVar1 = (pPVar3->values).elements.size_;
      __begin2.list = &pPVar3->values;
      do {
        if ((__begin2.list == &pPVar3->values) && (__begin2.index == sVar1 + 1 >> 1)) {
          return;
        }
        pSVar4 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                  iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::operator*(&__begin2)
                  ->super_SyntaxNode;
        if (pSVar4->kind == NameValuePragmaExpression) {
          pNVar5 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                             (pSVar4);
          sVar10 = Token::valueText(&pNVar5->name);
          __y._M_str = "enctype";
          __y._M_len = 7;
          bVar2 = std::operator==(sVar10,__y);
          if (bVar2) {
            pSVar4 = &not_null<slang::syntax::PragmaExpressionSyntax_*>::get(&pNVar5->value)->
                      super_SyntaxNode;
            value = slang::syntax::SyntaxNode::getFirstToken(pSVar4);
            local_40 = Token::valueText(&value);
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&valueText,&local_40,&local_99);
            strToLower(&valueText);
            __y_00._M_str = "uuencode";
            __y_00._M_len = 8;
            __x._M_str = valueText._M_dataplus._M_p;
            __x._M_len = valueText._M_string_length;
            bVar2 = std::operator==(__x,__y_00);
            PVar9 = UUEncode;
            if (bVar2) {
LAB_00185fd1:
              this->protectEncoding = PVar9;
            }
            else {
              __y_01._M_str = "base64";
              __y_01._M_len = 6;
              __x_00._M_str = valueText._M_dataplus._M_p;
              __x_00._M_len = valueText._M_string_length;
              bVar2 = std::operator==(__x_00,__y_01);
              PVar9 = Base64;
              if (bVar2) goto LAB_00185fd1;
              __y_02._M_str = "quoted-printable";
              __y_02._M_len = 0x10;
              __x_01._M_str = valueText._M_dataplus._M_p;
              __x_01._M_len = valueText._M_string_length;
              bVar2 = std::operator==(__x_01,__y_02);
              PVar9 = QuotedPrintable;
              if (bVar2) goto LAB_00185fd1;
              __y_05._M_str = "raw";
              __y_05._M_len = 3;
              __x_02._M_str = valueText._M_dataplus._M_p;
              __x_02._M_len = valueText._M_string_length;
              bVar2 = std::operator==(__x_02,__y_05);
              this->protectEncoding = Raw;
              if (!bVar2) {
                SVar11 = Token::range(&value);
                pDVar8 = addDiag(this,(DiagCode)0x2c0004,SVar11);
                sVar10 = Token::valueText(&value);
                Diagnostic::operator<<(pDVar8,sVar10);
              }
            }
            std::__cxx11::string::~string((string *)&valueText);
          }
          else {
            __y_03._M_str = "line_length";
            __y_03._M_len = 0xb;
            bVar2 = std::operator==(sVar10,__y_03);
            if (bVar2) {
              pPVar6 = not_null<slang::syntax::PragmaExpressionSyntax_*>::get(&pNVar5->value);
              oVar7 = requireUInt32(this,pPVar6);
              if (((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
                this->protectLineLength =
                     oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_payload;
              }
            }
            else {
              __y_04._M_str = "bytes";
              __y_04._M_len = 5;
              bVar2 = std::operator==(sVar10,__y_04);
              if (bVar2) {
                pPVar6 = not_null<slang::syntax::PragmaExpressionSyntax_*>::get(&pNVar5->value);
                oVar7 = requireUInt32(this,pPVar6);
                if (((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
                  this->protectBytes =
                       oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload;
                }
              }
              else if (sVar10._M_len != 0) {
                SVar11 = Token::range(&pNVar5->name);
                pDVar8 = addDiag(this,(DiagCode)0x2e0004,SVar11);
                arg = Token::valueText(&keyword_local);
                pDVar8 = Diagnostic::operator<<(pDVar8,arg);
                goto LAB_00186011;
              }
            }
          }
        }
        else {
          SVar11 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
          pDVar8 = addDiag(this,(DiagCode)0x270004,SVar11);
          sVar10 = Token::valueText(&keyword_local);
LAB_00186011:
          Diagnostic::operator<<(pDVar8,sVar10);
        }
        __begin2.index = __begin2.index + 1;
      } while( true );
    }
    SVar11 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar8 = addDiag(this,(DiagCode)0x270004,SVar11);
  sVar10 = Token::valueText(&keyword_local);
  Diagnostic::operator<<(pDVar8,sVar10);
  return;
}

Assistant:

void Preprocessor::handleProtectEncoding(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    protectLineLength = 0;
    protectBytes = 0;

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "enctype"sv) {
            auto value = nvp.value->getFirstToken();

            std::string valueText(value.valueText());
            strToLower(valueText);

            if (valueText == "uuencode"sv) {
                protectEncoding = ProtectEncoding::UUEncode;
            }
            else if (valueText == "base64"sv) {
                protectEncoding = ProtectEncoding::Base64;
            }
            else if (valueText == "quoted-printable"sv) {
                protectEncoding = ProtectEncoding::QuotedPrintable;
            }
            else if (valueText == "raw"sv) {
                protectEncoding = ProtectEncoding::Raw;
            }
            else {
                protectEncoding = ProtectEncoding::Raw;
                addDiag(diag::UnknownProtectEncoding, value.range()) << value.valueText();
            }
        }
        else if (name == "line_length"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectLineLength = *num;
        }
        else if (name == "bytes"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectBytes = *num;
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}